

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonwriter.cpp
# Opt level: O2

void QJsonPrivate::Writer::valueToJson(QCborValue *v,QByteArray *json,int indent,bool compact)

{
  long lVar1;
  
  if (v->container == (QCborContainerPrivate *)0x0) {
    lVar1 = 0x10;
  }
  else {
    lVar1 = (v->container->elements).d.size;
  }
  QByteArray::reserve(json,lVar1 + (json->d).size);
  valueContentToJson(v,json,indent,compact);
  if ((!compact) && ((v->t | 0x20) == Map)) {
    QByteArray::append(json,'\n');
    return;
  }
  return;
}

Assistant:

void Writer::valueToJson(const QCborValue &v, QByteArray &json, int indent, bool compact)
{
    const QCborContainerPrivate *container = QJsonPrivate::Value::container(v);
    json.reserve(json.size() + (container ? container->elements.size() : 16));
    valueContentToJson(v, json, indent, compact);

    if (!compact && (v.isMap() || v.isArray())) {
        json.append('\n');
    }
}